

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::addExport
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,Name value,
          Name name,ExternalKind kind)

{
  Module *this_00;
  char *pcVar1;
  Export *pEVar2;
  size_t local_a8;
  char *local_a0;
  string local_98;
  Err local_78;
  undefined1 local_54 [12];
  Name local_48;
  ExternalKind local_34;
  
  local_54._4_8_ = value.super_IString.str._M_str;
  local_48.super_IString.str._M_str = (char *)__return_storage_ptr__;
  local_34 = kind;
  pEVar2 = Module::getExportOrNull(this->wasm,name);
  if (pEVar2 == (Export *)0x0) {
    this_00 = this->wasm;
    local_78.msg._M_string_length = local_54._4_8_;
    local_78.msg.field_2._M_local_buf[0] = '\0';
    local_a8 = name.super_IString.str._M_len;
    local_a0 = name.super_IString.str._M_str;
    local_54._0_4_ = local_34;
    local_78.msg._M_dataplus._M_p = value.super_IString.str._M_len;
    std::
    make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
              ((Name *)(local_54 + 0xc),(ExternalKind *)&local_a8,
               (variant<wasm::Name,_wasm::HeapType> *)local_54);
    Module::addExport(this_00,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                              (local_54 + 0xc));
    std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
              ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)(local_54 + 0xc));
    *(_Variant_storage<false,wasm::Ok,wasm::Err> *)(local_48.super_IString.str._M_str + 0x20) =
         (_Variant_storage<false,wasm::Ok,wasm::Err>)0x0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"duplicate export",(allocator<char> *)&local_a8);
    Lexer::err(&local_78,&this->in,(ulong)pos,&local_98);
    pcVar1 = local_48.super_IString.str._M_str;
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)local_48.super_IString.str._M_str,
               &local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    local_48.super_IString.str._M_str = pcVar1;
  }
  return (Result<wasm::Ok> *)
         (_Variant_storage<false,wasm::Ok,wasm::Err> *)local_48.super_IString.str._M_str;
}

Assistant:

Result<> addExport(Index pos, Name value, Name name, ExternalKind kind) {
    if (wasm.getExportOrNull(name)) {
      return in.err(pos, "duplicate export");
    }
    wasm.addExport(builder.makeExport(name, value, kind));
    return Ok{};
  }